

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O1

void Gia_ManFromBridgeCex(FILE *pFile,Abc_Cex_t *pCex)

{
  int iVar1;
  uint uVar2;
  uchar *pBuffer;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Vec_Str_t *vStr;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  size_t sVar12;
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar6 = (char *)malloc(1000);
  vStr->pArray = pcVar6;
  vStr->nSize = 1;
  *pcVar6 = '\x02';
  vStr->nSize = 2;
  pcVar6[1] = '\x01';
  Gia_AigerWriteUnsigned(vStr,pCex->iPo);
  uVar7 = vStr->nCap;
  if (vStr->nSize == uVar7) {
    if ((int)uVar7 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar12 = 0x10;
    }
    else {
      sVar12 = (ulong)uVar7 * 2;
      if ((int)sVar12 <= (int)uVar7) goto LAB_001cbad0;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar12);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar12);
      }
    }
    vStr->pArray = pcVar6;
    vStr->nCap = (int)sVar12;
  }
LAB_001cbad0:
  iVar5 = vStr->nSize;
  vStr->nSize = iVar5 + 1;
  vStr->pArray[iVar5] = '\x01';
  Gia_AigerWriteUnsigned(vStr,pCex->iFrame);
  uVar7 = vStr->nCap;
  if (vStr->nSize == uVar7) {
    if ((int)uVar7 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar12 = 0x10;
    }
    else {
      sVar12 = (ulong)uVar7 * 2;
      if ((int)sVar12 <= (int)uVar7) goto LAB_001cbb4c;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar12);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar12);
      }
    }
    vStr->pArray = pcVar6;
    vStr->nCap = (int)sVar12;
  }
LAB_001cbb4c:
  iVar5 = vStr->nSize;
  vStr->nSize = iVar5 + 1;
  vStr->pArray[iVar5] = '\x01';
  Gia_AigerWriteUnsigned(vStr,pCex->iFrame + 1);
  iVar5 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar11 = 0;
    do {
      Gia_AigerWriteUnsigned(vStr,pCex->nPis);
      if (0 < pCex->nPis) {
        uVar7 = vStr->nCap;
        iVar1 = vStr->nSize;
        pcVar6 = vStr->pArray;
        lVar10 = 0;
        do {
          uVar8 = iVar5 + (int)lVar10;
          uVar2 = (&pCex[1].iPo)[(int)uVar8 >> 5];
          if ((int)lVar10 + iVar1 == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (pcVar6 == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pcVar6,0x10);
              }
              uVar7 = 0x10;
            }
            else {
              uVar4 = uVar7 * 2;
              if (SBORROW4(uVar7,uVar4) != 0 < (int)uVar7) {
                uVar7 = uVar4;
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = (char *)malloc((ulong)uVar4);
                }
                else {
                  pcVar6 = (char *)realloc(pcVar6,(ulong)uVar4);
                }
              }
            }
          }
          pcVar6[lVar10 + iVar1] = (uVar2 >> (uVar8 & 0x1f) & 1) == 0 ^ 3;
          lVar10 = lVar10 + 1;
          iVar9 = (int)lVar10;
        } while (iVar9 < pCex->nPis);
        vStr->nSize = iVar1 + iVar9;
        vStr->nCap = uVar7;
        vStr->pArray = pcVar6;
        iVar5 = iVar5 + iVar9;
      }
      bVar3 = iVar11 < pCex->iFrame;
      iVar11 = iVar11 + 1;
    } while (bVar3);
  }
  if (iVar5 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                  ,0x114,"void Gia_ManFromBridgeCex(FILE *, Abc_Cex_t *)");
  }
  uVar7 = vStr->nSize;
  uVar2 = vStr->nCap;
  if (uVar7 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar12 = 0x10;
    }
    else {
      sVar12 = (ulong)uVar2 * 2;
      if ((int)sVar12 <= (int)uVar2) goto LAB_001cbce4;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar12);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar12);
      }
    }
    vStr->pArray = pcVar6;
    vStr->nCap = (int)sVar12;
  }
LAB_001cbce4:
  vStr->nSize = uVar7 + 1;
  vStr->pArray[(int)uVar7] = '\x01';
  Gia_AigerWriteUnsigned(vStr,pCex->nRegs);
  if (0 < pCex->nRegs) {
    uVar7 = vStr->nCap;
    iVar5 = vStr->nSize;
    pcVar6 = vStr->pArray;
    lVar10 = 0;
    do {
      if (iVar5 + (int)lVar10 == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(pcVar6,0x10);
          }
          uVar7 = 0x10;
        }
        else {
          uVar2 = uVar7 * 2;
          if (SBORROW4(uVar7,uVar2) != 0 < (int)uVar7) {
            uVar7 = uVar2;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = (char *)malloc((ulong)uVar2);
            }
            else {
              pcVar6 = (char *)realloc(pcVar6,(ulong)uVar2);
            }
          }
        }
      }
      pcVar6[lVar10 + iVar5] = '\x02';
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 < pCex->nRegs);
    vStr->nSize = iVar5 + (int)lVar10;
    vStr->nCap = uVar7;
    vStr->pArray = pcVar6;
  }
  pBuffer = (uchar *)vStr->pArray;
  Gia_CreateHeader(pFile,0x65,vStr->nSize,pBuffer);
  if (pBuffer != (uchar *)0x0) {
    free(pBuffer);
    vStr->pArray = (char *)0x0;
  }
  free(vStr);
  fflush((FILE *)pFile);
  return;
}

Assistant:

void Gia_ManFromBridgeCex( FILE * pFile, Abc_Cex_t * pCex )
{
    int i, f, iBit;//, RetValue;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_StrPush( vStr, (char)BRIDGE_VALUE_0 ); // false
    Vec_StrPush( vStr, (char)1 ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsigned( vStr, pCex->iPo ); // number of the property (Armin's encoding)
    Vec_StrPush( vStr, (char)1 ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsigned( vStr, pCex->iFrame ); // depth

    Gia_AigerWriteUnsigned( vStr, 1 ); // concrete
    Gia_AigerWriteUnsigned( vStr, pCex->iFrame + 1 ); // number of frames (1 more than depth)
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Gia_AigerWriteUnsigned( vStr, pCex->nPis ); // num of inputs
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            Vec_StrPush( vStr, (char)(Abc_InfoHasBit(pCex->pData, iBit) ? BRIDGE_VALUE_1:BRIDGE_VALUE_0) ); // value
    }
    assert( iBit == pCex->nBits );
    Vec_StrPush( vStr, (char)1 ); // the number of frames (for a concrete counter-example)
    Gia_AigerWriteUnsigned( vStr, pCex->nRegs ); // num of flops
    for ( i = 0; i < pCex->nRegs; i++ )
        Vec_StrPush( vStr, (char)BRIDGE_VALUE_0 ); // always zero!!!
//    RetValue = fwrite( Vec_StrArray(vStr), Vec_StrSize(vStr), 1, pFile );
    Gia_CreateHeader(pFile, 101/*type=Result*/, Vec_StrSize(vStr), (unsigned char*)Vec_StrArray(vStr));

    Vec_StrFree( vStr );
    fflush(pFile);
}